

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_MPEG2.cpp
# Opt level: O3

h__Reader * __thiscall
ASDCP::MPEG2::MXFReader::h__Reader::ReadFrameGOPStart
          (h__Reader *this,ui32_t FrameNum,FrameBuffer *FrameBuf,AESDecContext *Ctx,
          HMACContext *HMAC)

{
  ui32_t KeyFrameNum;
  uint local_94;
  
  FindFrameGOPStart(this,FrameNum,(ui32_t *)FrameBuf);
  if (-1 < *(int *)&(this->super_h__ASDCPReader).
                    super_TrackFileReader<ASDCP::MXF::OP1aHeader,_ASDCP::MXF::OPAtomIndexFooter>.
                    _vptr_TrackFileReader) {
    ReadFrame((h__Reader *)&stack0xffffffffffffff70,FrameNum,(FrameBuffer *)(ulong)local_94,Ctx,HMAC
             );
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&stack0xffffffffffffff70);
    Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff70);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MPEG2::MXFReader::h__Reader::ReadFrameGOPStart(ui32_t FrameNum, FrameBuffer& FrameBuf,
						      AESDecContext* Ctx, HMACContext* HMAC)
{
  ui32_t KeyFrameNum;

  Result_t result = FindFrameGOPStart(FrameNum, KeyFrameNum);

  if ( ASDCP_SUCCESS(result) )
    result = ReadFrame(KeyFrameNum, FrameBuf, Ctx, HMAC);

  return result;
}